

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::ResolvesFeaturesForImpl(DescriptorPool *this,int extension_number)

{
  bool bVar1;
  FeatureSetDefaults *this_00;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this_01;
  reference this_02;
  FeatureSet *pFVar2;
  Reflection *this_03;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_d0;
  anon_class_8_1_685a9dc7_for__M_pred local_c8;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_c0 [3];
  undefined1 local_a8 [8];
  FeatureSet features;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  FeatureSetDefaults_FeatureSetEditionDefault *edition_default;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *__range2;
  DescriptorPool *pDStack_18;
  int extension_number_local;
  DescriptorPool *this_local;
  
  __range2._4_4_ = extension_number;
  pDStack_18 = this;
  this_00 = GetFeatureSetDefaults(this);
  this_01 = FeatureSetDefaults::defaults(this_00);
  __end2 = RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::begin
                     (this_01);
  edition_default =
       (FeatureSetDefaults_FeatureSetEditionDefault *)
       RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::end(this_01)
  ;
  while (bVar1 = internal::operator!=(&__end2,(iterator *)&edition_default), bVar1) {
    this_02 = internal::
              RepeatedPtrIterator<const_google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
              ::operator*(&__end2);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)((long)&features.field_0 + 0x38));
    pFVar2 = FeatureSetDefaults_FeatureSetEditionDefault::fixed_features(this_02);
    FeatureSet::FeatureSet((FeatureSet *)local_a8,pFVar2);
    pFVar2 = FeatureSetDefaults_FeatureSetEditionDefault::overridable_features(this_02);
    FeatureSet::MergeFrom((FeatureSet *)local_a8,pFVar2);
    this_03 = FeatureSet::GetReflection();
    Reflection::ListFields
              (this_03,(Message *)local_a8,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)((long)&features.field_0 + 0x38));
    local_c8.extension_number = (int *)((long)&__range2 + 4);
    local_c0[0]._M_current =
         (FieldDescriptor **)
         absl::lts_20250127::
         c_find_if<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,google::protobuf::DescriptorPool::ResolvesFeaturesForImpl(int)const::__0>
                   ((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)((long)&features.field_0 + 0x38),&local_c8);
    local_d0._M_current =
         (FieldDescriptor **)
         std::
         vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)((long)&features.field_0 + 0x38));
    bVar1 = __gnu_cxx::operator==(local_c0,&local_d0);
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    FeatureSet::~FeatureSet((FeatureSet *)local_a8);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)((long)&features.field_0 + 0x38));
    if (bVar1) goto LAB_0015f29d;
    internal::
    RepeatedPtrIterator<const_google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::
    operator++(&__end2);
  }
  this_local._7_1_ = 1;
LAB_0015f29d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DescriptorPool::ResolvesFeaturesForImpl(int extension_number) const {
  for (const auto& edition_default : GetFeatureSetDefaults().defaults()) {
    std::vector<const FieldDescriptor*> fields;
    auto features = edition_default.fixed_features();
    features.MergeFrom(edition_default.overridable_features());
    features.GetReflection()->ListFields(features, &fields);
    if (absl::c_find_if(fields, [&](const FieldDescriptor* field) {
          return field->number() == extension_number;
        }) == fields.end()) {
      return false;
    }
  }
  return true;
}